

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  mz_bool mVar1;
  FILE *__stream;
  char *pArchive_name_00;
  char *in_RDX;
  char *unaff_RBX;
  time_t *in_RDI;
  mz_uint unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  mz_uint in_stack_00000010;
  mz_bool status;
  time_t *pFile_time;
  time_t file_modified_time;
  mz_uint64 uncomp_size;
  FILE *pSrc_file;
  void *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 *max_size;
  FILE *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  mz_uint16 in_stack_ffffffffffffffe0;
  mz_uint in_stack_ffffffffffffffe8;
  mz_uint32 in_stack_fffffffffffffff0;
  
  memset(&stack0xffffffffffffff98,0,8);
  max_size = &stack0xffffffffffffff98;
  mVar1 = mz_zip_get_file_modified_time
                    ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI);
  if (mVar1 == 0) {
    if (in_RDI != (time_t *)0x0) {
      *(undefined4 *)((long)in_RDI + 0x1c) = 0x17;
    }
    mVar1 = 0;
  }
  else {
    __stream = fopen64(in_RDX,"rb");
    if (__stream == (FILE *)0x0) {
      if (in_RDI != (time_t *)0x0) {
        *(undefined4 *)((long)in_RDI + 0x1c) = 0x11;
      }
      mVar1 = 0;
    }
    else {
      fseeko64(__stream,0,2);
      pArchive_name_00 = (char *)ftello64(__stream);
      fseeko64(__stream,0,0);
      mVar1 = mz_zip_writer_add_cfile
                        ((mz_zip_archive *)__stream,pArchive_name_00,in_stack_ffffffffffffff98,
                         (mz_uint64)max_size,
                         (time_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,unaff_RBX,unaff_retaddr
                         ,(char *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010);
      fclose(__stream);
    }
  }
  return mVar1;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  MZ_FILE *pSrc_file = NULL;
  mz_uint64 uncomp_size = 0;
  MZ_TIME_T file_modified_time;
  MZ_TIME_T *pFile_time = NULL;
  mz_bool status;

  memset(&file_modified_time, 0, sizeof(file_modified_time));

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
  pFile_time = &file_modified_time;
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_STAT_FAILED);
#endif

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  status = mz_zip_writer_add_cfile(
      pZip, pArchive_name, pSrc_file, uncomp_size, pFile_time, pComment,
      comment_size, level_and_flags, ext_attributes, NULL, 0, NULL, 0);

  MZ_FCLOSE(pSrc_file);

  return status;
}